

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O0

void thread_callback(void *param_1)

{
  int iVar1;
  undefined1 local_90 [8];
  sigset_t mask;
  void *param_0_local;
  
  mask.__val[0xf] = (unsigned_long)param_1;
  iVar1 = sigaltstack((sigaltstack *)&alt_stack,(sigaltstack *)0x0);
  if (iVar1 < 0) {
    fprintf(_stderr,"Fossilize ERROR: Failed to install alternate stack.\n");
    fflush(_stderr);
  }
  sigemptyset((sigset_t *)local_90);
  iVar1 = pthread_sigmask(2,(__sigset_t *)local_90,(__sigset_t *)0x0);
  if (iVar1 < 0) {
    fprintf(_stderr,"Fossilize ERROR: Failed to set signal mask.\n");
    fflush(_stderr);
  }
  return;
}

Assistant:

static void thread_callback(void *)
{
	// Alternate signal stacks set by sigaltstack are per-thread.
	// Need to install the alternate stack on all threads.
	if (sigaltstack(&alt_stack, nullptr) < 0)
		LOGE("Failed to install alternate stack.\n");

	// Don't block any signals in the worker threads.
	sigset_t mask;
	sigemptyset(&mask);
	if (pthread_sigmask(SIG_SETMASK, &mask, nullptr) < 0)
		LOGE("Failed to set signal mask.\n");
}